

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::Transaction::SetTxOutValue(Transaction *this,uint32_t index,Amount *value)

{
  void *pvVar1;
  long lVar2;
  int64_t iVar3;
  reference pvVar4;
  wally_tx_output *output;
  wally_tx *tx_pointer;
  Amount *value_local;
  uint32_t index_local;
  Transaction *this_local;
  
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
            (this,(ulong)index,0x2d6,"SetTxOutValue");
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  if (pvVar1 != (void *)0x0) {
    lVar2 = *(long *)((long)pvVar1 + 0x20);
    iVar3 = Amount::GetSatoshiValue(value);
    *(int64_t *)(lVar2 + (ulong)index * 0x70) = iVar3;
    pvVar4 = ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::operator[]
                       (&this->vout_,(ulong)index);
    (*(pvVar4->super_AbstractTxOut)._vptr_AbstractTxOut[2])(pvVar4,value);
  }
  return;
}

Assistant:

void Transaction::SetTxOutValue(uint32_t index, const Amount &value) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer != nullptr) {
    struct wally_tx_output *output = tx_pointer->outputs + index;
    output->satoshi = static_cast<uint64_t>(value.GetSatoshiValue());

    vout_[index].SetValue(value);
    // CallbackStateChange(kStateChangeAddTxOut);
  }
}